

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksDB.cpp
# Opt level: O0

TalkRef * __thiscall
cppti::TalksDB::talkRefFromTalk(TalkRef *__return_storage_ptr__,TalksDB *this,Talk *talk)

{
  bool bVar1;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  reference pbVar5;
  string_view sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  reference local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  string_view local_d0;
  Speaker local_c0;
  Speaker *local_98;
  Speaker *local_90;
  __normal_iterator<cppti::TalksDB::Speaker_*,_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>_>
  local_88;
  reference local_80;
  Speaker *index_speaker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *speaker;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Talk *talk_local;
  TalksDB *this_local;
  TalkRef *ret;
  
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>::
  vector(&__return_storage_ptr__->speakers);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->title);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&__return_storage_ptr__->slides);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&__return_storage_ptr__->conference);
  __return_storage_ptr__->year = 0;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->link);
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&__return_storage_ptr__->tags);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&talk->speakers);
  std::vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>::
  reserve(&__return_storage_ptr__->speakers,sVar2);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&talk->speakers);
  speaker = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&talk->speakers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&speaker), bVar1) {
    id.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)&index_speaker,(string *)id.field_2._8_8_);
    toSnakeCase((string *)&index_speaker);
    local_90 = (Speaker *)
               std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::begin
                         (&this->speakers);
    local_98 = (Speaker *)
               std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::end
                         (&this->speakers);
    local_88 = std::
               lower_bound<__gnu_cxx::__normal_iterator<cppti::TalksDB::Speaker*,std::vector<cppti::TalksDB::Speaker,std::allocator<cppti::TalksDB::Speaker>>>,std::__cxx11::string,cppti::TalksDB::talkRefFromTalk(cppti::Talk_const&)::__0>
                         (local_90,local_98,&index_speaker);
    local_80 = __gnu_cxx::
               __normal_iterator<cppti::TalksDB::Speaker_*,_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>_>
               ::operator*(&local_88);
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
    local_c0.id = sVar6;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&local_80->display_name);
    local_c0.display_name = sVar6;
    std::vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
    ::emplace_back<cppti::TalksDB::TalkRef::Speaker>(&__return_storage_ptr__->speakers,&local_c0);
    std::__cxx11::string::~string((string *)&index_speaker);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->conferences);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->conferences);
  local_d8 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (iVar3._M_current,iVar4._M_current,&talk->conference);
  pbVar5 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_d8);
  local_d0 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5)
  ;
  __return_storage_ptr__->conference = local_d0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&talk->tags);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&__return_storage_ptr__->tags,sVar2);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&talk->tags);
  tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&talk->tags);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&tag), bVar1) {
    local_108 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    iVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->tags);
    iVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->tags);
    local_110 = std::
                lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (iVar3._M_current,iVar4._M_current,local_108);
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_110);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::__cxx11::string&>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&__return_storage_ptr__->tags,pbVar5);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->title,(string *)&talk->title);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&__return_storage_ptr__->slides,&talk->slides);
  __return_storage_ptr__->year = talk->year;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->link,(string *)&talk->link);
  return __return_storage_ptr__;
}

Assistant:

TalksDB::TalkRef TalksDB::talkRefFromTalk(Talk const& talk)
{
  auto ret = TalkRef{};

  ret.speakers.reserve(talk.speakers.size());
  for (auto const& speaker : talk.speakers)
  {
    auto id = speaker;
    toSnakeCase(id);
    auto const& index_speaker = *std::lower_bound(
        this->speakers.begin(),
        this->speakers.end(),
        id,
        [&](auto const& hay, auto const& needle) { return hay.id < needle; });
    ret.speakers.emplace_back(
        TalkRef::Speaker{index_speaker.id, index_speaker.display_name});
  }

  ret.conference = *std::lower_bound(
      this->conferences.begin(), this->conferences.end(), talk.conference);

  ret.tags.reserve(talk.tags.size());
  for (auto const& tag : talk.tags)
    ret.tags.emplace_back(
        *std::lower_bound(this->tags.begin(), this->tags.end(), tag));

  ret.title = talk.title;
  ret.slides = talk.slides;
  ret.year = talk.year;
  ret.link = talk.link;
  return ret;
}